

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityMarking.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::EntityMarking::EntityMarking
          (EntityMarking *this,EntityMarkingCharacterSet MarkingCharSet,KString *MarkingText)

{
  ulong uVar1;
  KException *this_00;
  allocator<char> local_41;
  KString local_40;
  KString *local_20;
  KString *MarkingText_local;
  EntityMarking *pEStack_10;
  EntityMarkingCharacterSet MarkingCharSet_local;
  EntityMarking *this_local;
  
  local_20 = MarkingText;
  MarkingText_local._4_4_ = MarkingCharSet;
  pEStack_10 = this;
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__EntityMarking_00331c08;
  this->m_ui8EntityMarkingCharacterSet = (KUINT8)MarkingText_local._4_4_;
  uVar1 = std::__cxx11::string::size();
  if (0xb < uVar1) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"EntityMarking",&local_41);
    KException::KException(this_00,&local_40,3);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  this->m_sEntityMarkingString[8] = '\0';
  this->m_sEntityMarkingString[9] = '\0';
  this->m_sEntityMarkingString[10] = '\0';
  this->m_sEntityMarkingString[0xb] = '\0';
  this->m_sEntityMarkingString[0] = '\0';
  this->m_sEntityMarkingString[1] = '\0';
  this->m_sEntityMarkingString[2] = '\0';
  this->m_sEntityMarkingString[3] = '\0';
  this->m_sEntityMarkingString[4] = '\0';
  this->m_sEntityMarkingString[5] = '\0';
  this->m_sEntityMarkingString[6] = '\0';
  this->m_sEntityMarkingString[7] = '\0';
  SetEntityMarkingString(this,local_20);
  return;
}

Assistant:

EntityMarking::EntityMarking(const EntityMarkingCharacterSet MarkingCharSet, const KString &MarkingText) noexcept(false)
        :
	m_ui8EntityMarkingCharacterSet( MarkingCharSet )
{
	if( MarkingText.size() > 11 ) throw KException( __FUNCTION__, STRING_PDU_SIZE_TOO_BIG );

	memset( m_sEntityMarkingString, 0x00, sizeof( m_sEntityMarkingString ) );
	SetEntityMarkingString( MarkingText );    
}